

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void __thiscall ByteCodeGenerator::EmitScopeObjectInit(ByteCodeGenerator *this,FuncInfo *funcInfo)

{
  ushort uVar1;
  uint count;
  int iVar2;
  ParseableFunctionInfo *this_00;
  ParseNode *pPVar3;
  code *pcVar4;
  bool bVar5;
  uint uVar6;
  undefined4 *puVar7;
  FunctionBody *pFVar8;
  PropertyIdArray *pPVar9;
  Symbol *pSVar10;
  ParseNodeVar *pPVar11;
  ParseNodePtr pPVar12;
  ParseNodeFnc *pPVar13;
  ParseNode *pnode;
  Symbol *sym;
  int iVar14;
  ulong uVar15;
  anon_class_32_4_e369621f local_a0;
  anon_class_8_1_3fcf6586 local_80;
  PropertyIdArray *local_78;
  ulong local_70;
  Scope *local_68;
  undefined4 *local_60;
  FuncInfo *local_58;
  uint local_50;
  PropertyId local_4c;
  uint cachedFuncCount;
  PropertyId firstFuncSlot;
  PropertyIdArray *propIds;
  ParseNodeFnc *pPStack_38;
  PropertyId firstVarSlot;
  
  this_00 = funcInfo->byteCodeFunction;
  bVar5 = Js::FunctionProxy::IsFunctionBody(&this_00->super_FunctionProxy);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                       ,0x59e,"(IsFunctionBody())","IsFunctionBody()");
    if (!bVar5) goto LAB_00800c2d;
    *puVar7 = 0;
  }
  if ((this_00->flags & Flags_StackNestedFunc) != Flags_None) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar7 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                       ,0x627,
                       "(!funcInfo->byteCodeFunction->GetFunctionBody()->DoStackNestedFunc())",
                       "!funcInfo->byteCodeFunction->GetFunctionBody()->DoStackNestedFunc()");
    if (!bVar5) goto LAB_00800c2d;
    *puVar7 = 0;
  }
  if ((funcInfo->field_0xb5 & 1) == 0) {
    return;
  }
  local_68 = funcInfo->currentChildScope;
  count = local_68->scopeSlotCount;
  uVar15 = (ulong)count;
  local_4c = -1;
  propIds._4_4_ = 0xffffffff;
  local_50 = 0;
  if ((0x3ffffffe < count >> 2) || (0x3ffffffb < count)) {
    Math::DefaultOverflowPolicy();
  }
  pFVar8 = FuncInfo::GetParsedFunctionBody(funcInfo);
  pPVar9 = Js::FunctionBody::AllocatePropertyIdArrayForFormals(pFVar8,count * 4 + 0x10,count,'\x04')
  ;
  pPStack_38 = funcInfo->root;
  _cachedFuncCount = pPVar9;
  if (((funcInfo->field_0xb5 & 2) != 0) &&
     (pSVar10 = ParseNodeFnc::GetFuncSymbol(pPStack_38), pSVar10->scope == funcInfo->bodyScope)) {
    pSVar10 = ParseNodeFnc::GetFuncSymbol(pPStack_38);
    Symbol::SaveToPropIdArray(pSVar10,pPVar9,this,(PropertyId *)0x0);
  }
  pPVar12 = pPStack_38->pnodeParams;
  local_70 = uVar15;
  if ((funcInfo->field_0xb4 & 8) == 0) {
    while (local_58 = funcInfo, pPVar12 != (ParseNode *)0x0) {
      if ((byte)(pPVar12->nop + ~knopList) < 3) {
        pPVar11 = ParseNode::AsParseNodeVar(pPVar12);
        Symbol::SaveToPropIdArray(pPVar11->sym,pPVar9,this,(PropertyId *)0x0);
      }
      pPVar12 = ParseNode::GetFormalNext(pPVar12);
      funcInfo = local_58;
    }
    pPVar3 = pPStack_38->pnodeRest;
    if ((pPVar3 != (ParseNode *)0x0) && ((byte)(pPVar3->nop + ~knopList) < 3)) {
      pPVar11 = ParseNode::AsParseNodeVar(pPVar3);
      pSVar10 = pPVar11->sym;
LAB_008009c4:
      Symbol::SaveToPropIdArray(pSVar10,pPVar9,this,(PropertyId *)0x0);
    }
  }
  else {
    local_58 = funcInfo;
    if (pPVar12 != (ParseNodePtr)0x0) {
      iVar14 = 0;
      local_60 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      local_78 = pPVar9;
LAB_00800885:
      if ((byte)(pPVar12->nop + ~knopList) < 3) {
        pPVar11 = ParseNode::AsParseNodeVar(pPVar12);
        pSVar10 = pPVar11->sym;
        if (pSVar10 == (Symbol *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = local_60;
          *local_60 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x64d,"(sym)","sym");
          if (!bVar5) goto LAB_00800c2d;
          *puVar7 = 0;
          pPVar9 = local_78;
        }
        puVar7 = local_60;
        iVar2 = pSVar10->scopeSlot;
        if (iVar14 == iVar2) {
          Symbol::SaveToPropIdArray(pSVar10,pPVar9,this,(PropertyId *)0x0);
          goto LAB_00800970;
        }
        if (iVar2 != -1 && iVar14 < iVar2) goto LAB_00800964;
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x657,
                           "(sym->GetScopeSlot() != Js::Constants::NoProperty && sym->GetScopeSlot() > slot)"
                           ,
                           "sym->GetScopeSlot() != Js::Constants::NoProperty && sym->GetScopeSlot() > slot"
                          );
        if (!bVar5) goto LAB_00800c2d;
        *puVar7 = 0;
      }
LAB_00800964:
      (&pPVar9[1].count)[iVar14] = 0xffffffff;
LAB_00800970:
      iVar14 = iVar14 + 1;
      pPVar12 = ParseNode::GetFormalNext(pPVar12);
      if (pPVar12 == (ParseNodePtr)0x0) goto LAB_00800987;
      goto LAB_00800885;
    }
LAB_00800987:
    funcInfo = local_58;
    pPVar3 = pPStack_38->pnodeRest;
    if ((pPVar3 != (ParseNode *)0x0) && ((byte)(pPVar3->nop + ~knopList) < 3)) {
      pPVar11 = ParseNode::AsParseNodeVar(pPVar3);
      pSVar10 = pPVar11->sym;
      bVar5 = Symbol::IsInSlot(pSVar10,this,funcInfo,false);
      if (bVar5) goto LAB_008009c4;
    }
  }
  local_a0.propIds = (PropertyIdArray **)&cachedFuncCount;
  local_a0.firstFuncSlot = &local_4c;
  local_a0.cachedFuncCount = &local_50;
  local_a0.this = this;
  pPVar13 = ParseNode::AsParseNodeFnc(&pPStack_38->super_ParseNode);
  local_80.fn = &local_a0;
  MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1658:42)>
  ::anon_class_8_1_3fcf6586::operator()(&local_80,pPVar13->pnodeScopes->pnodeScopes);
  if (pPVar13->pnodeBodyScope != (ParseNodeBlock *)0x0) {
    MapContainerScopeFunctions<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp:1658:42)>
    ::anon_class_8_1_3fcf6586::operator()(&local_80,pPVar13->pnodeBodyScope->pnodeScopes);
  }
  if (local_68->scopeType == ScopeType_Parameter) {
    if ((funcInfo->field_0xb5 & 0x80) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x6bc,"(!funcInfo->IsBodyAndParamScopeMerged())",
                         "!funcInfo->IsBodyAndParamScopeMerged()");
      if (!bVar5) {
LAB_00800c2d:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar7 = 0;
    }
  }
  else {
    pPVar12 = pPStack_38->pnodeVars;
    if (pPVar12 != (ParseNodePtr)0x0) {
      do {
        pPVar11 = ParseNode::AsParseNodeVar(pPVar12);
        pSVar10 = pPVar11->sym;
        pPVar11 = ParseNode::AsParseNodeVar(pPVar12);
        uVar1 = *(ushort *)&pSVar10->field_0x42;
        if ((pPVar11->isBlockScopeFncDeclVar == '\0') || ((uVar1 & 2) == 0)) {
          if (((uVar1 & 0x40) != 0) ||
             ((sym = pSVar10, (uVar1 & 2) != 0 && (pPVar12->nop == knopVarDecl)))) {
            for (sym = local_68->m_symList; sym != (Symbol *)0x0; sym = sym->next) {
              bVar5 = JsUtil::CharacterBuffer<char16_t>::operator==(&sym->name,&pSVar10->name);
              if (bVar5) goto LAB_00800b13;
            }
            sym = (Symbol *)0x0;
          }
LAB_00800b13:
          Symbol::SaveToPropIdArray(sym,_cachedFuncCount,this,(PropertyId *)((long)&propIds + 4));
        }
        pPVar11 = ParseNode::AsParseNodeVar(pPVar12);
        pPVar12 = pPVar11->pnodeNext;
      } while (pPVar12 != (ParseNodePtr)0x0);
    }
    pPVar12 = pPStack_38->pnodeScopes->pnodeLexVars;
    if (pPVar12 != (ParseNodePtr)0x0) {
      do {
        pPVar11 = ParseNode::AsParseNodeVar(pPVar12);
        Symbol::SaveToPropIdArray
                  (pPVar11->sym,_cachedFuncCount,this,(PropertyId *)((long)&propIds + 4));
        pPVar11 = ParseNode::AsParseNodeVar(pPVar12);
        pPVar12 = pPVar11->pnodeNext;
      } while (pPVar12 != (ParseNodePtr)0x0);
    }
    funcInfo = local_58;
    pPVar12 = pPStack_38->pnodeBodyScope->pnodeLexVars;
    if (pPVar12 != (ParseNodePtr)0x0) {
      do {
        pPVar11 = ParseNode::AsParseNodeVar(pPVar12);
        Symbol::SaveToPropIdArray
                  (pPVar11->sym,_cachedFuncCount,this,(PropertyId *)((long)&propIds + 4));
        pPVar11 = ParseNode::AsParseNodeVar(pPVar12);
        pPVar12 = pPVar11->pnodeNext;
      } while (pPVar12 != (ParseNodePtr)0x0);
    }
  }
  pPVar9 = _cachedFuncCount;
  uVar15 = local_70;
  (&_cachedFuncCount[1].count)[local_70] = local_50;
  *(PropertyId *)(&_cachedFuncCount[1].extraSlots + local_70 * 4) = local_4c;
  (&_cachedFuncCount[2].count)[local_70] = propIds._4_4_;
  pFVar8 = FuncInfo::GetParsedFunctionBody(funcInfo);
  uVar6 = Js::FunctionBody::NewObjectLiteral(pFVar8);
  *(uint *)(&pPVar9[2].extraSlots + uVar15 * 4) = uVar6;
  _cachedFuncCount->hasNonSimpleParams = (Type)((byte)(funcInfo->root->fncFlags >> 0xf) & 1);
  pFVar8 = FuncInfo::GetParsedFunctionBody(funcInfo);
  pFVar8->hasCachedScopePropIds = true;
  return;
}

Assistant:

void ByteCodeGenerator::EmitScopeObjectInit(FuncInfo *funcInfo)
{
    Assert(!funcInfo->byteCodeFunction->GetFunctionBody()->DoStackNestedFunc());

    if (!funcInfo->GetHasCachedScope() /* || forcing scope/inner func caching */)
    {
        return;
    }

    Scope* currentScope = funcInfo->GetCurrentChildScope();
    uint slotCount = currentScope->GetScopeSlotCount();
    uint cachedFuncCount = 0;
    Js::PropertyId firstFuncSlot = Js::Constants::NoProperty;
    Js::PropertyId firstVarSlot = Js::Constants::NoProperty;

    uint extraAlloc = UInt32Math::Add(slotCount, Js::ActivationObjectEx::ExtraSlotCount());
    extraAlloc = UInt32Math::Mul(extraAlloc, sizeof(Js::PropertyId));

    // Create and fill the array of local property ID's.
    // They all have slots assigned to them already (if they need them): see StartEmitFunction.

    Js::PropertyIdArray *propIds = funcInfo->GetParsedFunctionBody()->AllocatePropertyIdArrayForFormals(extraAlloc, slotCount, Js::ActivationObjectEx::ExtraSlotCount());

    ParseNodeFnc *pnodeFnc = funcInfo->root;

    if (funcInfo->GetFuncExprNameReference() && pnodeFnc->GetFuncSymbol()->GetScope() == funcInfo->GetBodyScope())
    {
        Symbol::SaveToPropIdArray(pnodeFnc->GetFuncSymbol(), propIds, this);
    }

    if (funcInfo->GetHasArguments())
    {
        // Because the arguments object can access all instances of same-named formals ("function(x,x){...}"),
        // be sure we initialize any duplicate appearances of a formal parameter to "NoProperty".
        Js::PropertyId slot = 0;
        auto initArg = [&](ParseNode *pnode)
        {
            if (pnode->IsVarLetOrConst())
            {
                Symbol *sym = pnode->AsParseNodeVar()->sym;
                Assert(sym);
                if (sym->GetScopeSlot() == slot)
                {
                    // This is the last appearance of the formal, so record the ID.
                    Symbol::SaveToPropIdArray(sym, propIds, this);
                }
                else
                {
                    // This is an earlier duplicate appearance of the formal, so use NoProperty as a placeholder
                    // since this slot can't be accessed by name.
                    Assert(sym->GetScopeSlot() != Js::Constants::NoProperty && sym->GetScopeSlot() > slot);
                    propIds->elements[slot] = Js::Constants::NoProperty;
                }
            }
            else
            {
                // This is for patterns
                propIds->elements[slot] = Js::Constants::NoProperty;
            }
            slot++;
        };
        MapFormalsWithoutRest(pnodeFnc, initArg);

        ParseNodePtr rest = pnodeFnc->pnodeRest;
        if (rest != nullptr && rest->IsVarLetOrConst())
        {
            // If the rest is in the slot - we need to keep that slot.
            Symbol *sym = rest->AsParseNodeVar()->sym;
            if (sym->IsInSlot(this, funcInfo))
            {
                Symbol::SaveToPropIdArray(sym, propIds, this);
            }
        }
    }
    else
    {
        MapFormals(pnodeFnc, [&](ParseNode *pnode)
        {
            if (pnode->IsVarLetOrConst())
            {
                Symbol::SaveToPropIdArray(pnode->AsParseNodeVar()->sym, propIds, this);
            }
        });
    }

    auto saveFunctionVarsToPropIdArray = [&](ParseNode *pnodeFunction)
    {
        if (pnodeFunction->AsParseNodeFnc()->IsDeclaration())
        {
            ParseNode *pnodeName = pnodeFunction->AsParseNodeFnc()->pnodeName;
            if (pnodeName != nullptr)
            {
                while (pnodeName->nop == knopList)
                {
                    if (pnodeName->AsParseNodeBin()->pnode1->nop == knopVarDecl)
                    {
                        Symbol *sym = pnodeName->AsParseNodeBin()->pnode1->AsParseNodeVar()->sym;
                        if (sym)
                        {
                            Symbol::SaveToPropIdArray(sym, propIds, this, &firstFuncSlot);
                        }
                    }
                    pnodeName = pnodeName->AsParseNodeBin()->pnode2;
                }
                if (pnodeName->nop == knopVarDecl)
                {
                    Symbol *sym = pnodeName->AsParseNodeVar()->sym;
                    if (sym)
                    {
                        Symbol::SaveToPropIdArray(sym, propIds, this, &firstFuncSlot);
                        cachedFuncCount++;
                    }
                }
            }
        }
    };
    MapContainerScopeFunctions(pnodeFnc, saveFunctionVarsToPropIdArray);

    if (currentScope->GetScopeType() != ScopeType_Parameter)
    {
        ParseNode *pnode;
        Symbol *sym;
        for (pnode = pnodeFnc->pnodeVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            sym = pnode->AsParseNodeVar()->sym;
            if (!(pnode->AsParseNodeVar()->isBlockScopeFncDeclVar && sym->GetIsBlockVar()))
            {
                if (sym->GetIsCatch() || (pnode->nop == knopVarDecl && sym->GetIsBlockVar()))
                {
                    sym = currentScope->FindLocalSymbol(sym->GetName());
                }
                Symbol::SaveToPropIdArray(sym, propIds, this, &firstVarSlot);
            }
        }

        ParseNodeBlock *pnodeBlock = pnodeFnc->pnodeScopes;
        for (pnode = pnodeBlock->pnodeLexVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            sym = pnode->AsParseNodeVar()->sym;
            Symbol::SaveToPropIdArray(sym, propIds, this, &firstVarSlot);
        }

        pnodeBlock = pnodeFnc->pnodeBodyScope;
        for (pnode = pnodeBlock->pnodeLexVars; pnode; pnode = pnode->AsParseNodeVar()->pnodeNext)
        {
            sym = pnode->AsParseNodeVar()->sym;
            Symbol::SaveToPropIdArray(sym, propIds, this, &firstVarSlot);
        }
    }
    else
    {
        Assert(!funcInfo->IsBodyAndParamScopeMerged());
    }

    // Write the first func slot and first var slot into the auxiliary data
    Js::PropertyId *slots = propIds->elements + slotCount;
    slots[0] = cachedFuncCount;
    slots[1] = firstFuncSlot;
    slots[2] = firstVarSlot;
    slots[3] = funcInfo->GetParsedFunctionBody()->NewObjectLiteral();

    propIds->hasNonSimpleParams = funcInfo->root->HasNonSimpleParameterList();

    funcInfo->GetParsedFunctionBody()->SetHasCachedScopePropIds(true);
}